

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getMultiIndex<(TasGrid::RuleLocal::erule)3>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          double *x)

{
  int point;
  int j;
  long lVar1;
  double dVar2;
  allocator_type local_31;
  
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,&local_31);
  for (lVar1 = 0; lVar1 < (this->super_BaseCanonicalGrid).num_dimensions; lVar1 = lVar1 + 1) {
    point = -1;
    do {
      point = point + 1;
      dVar2 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)3>(point);
    } while (1e-12 < ABS(dVar2 - x[lVar1]));
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar1] = point;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GridLocalPolynomial::getMultiIndex(const double x[]){
    std::vector<int> p(num_dimensions); // convert x to p, maybe expensive
    for(int j=0; j<num_dimensions; j++){
        int i = 0;
        while(std::abs(RuleLocal::getNode<effrule>(i) - x[j]) > Maths::num_tol) i++;
        p[j] = i;
    }
    return p;
}